

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Scl_LibertyPrintTemplates(Vec_Ptr_t *vRes)

{
  int iVar1;
  Vec_Flt_t *vVec;
  int local_1c;
  int i;
  Vec_Flt_t *vArray;
  Vec_Ptr_t *vRes_local;
  
  iVar1 = Vec_PtrSize(vRes);
  if (iVar1 % 4 == 0) {
    iVar1 = Vec_PtrSize(vRes);
    printf("There are %d slew/load templates\n",(long)iVar1 % 4 & 0xffffffff);
    for (local_1c = 0; iVar1 = Vec_PtrSize(vRes), local_1c < iVar1; local_1c = local_1c + 1) {
      vVec = (Vec_Flt_t *)Vec_PtrEntry(vRes,local_1c);
      if (local_1c % 4 == 0) {
        printf("%s\n",vVec);
      }
      else if (local_1c % 4 == 1) {
        printf("%d\n",(ulong)(vVec != (Vec_Flt_t *)0x0));
      }
      else if ((local_1c % 4 == 2) || (local_1c % 4 == 3)) {
        Vec_FltPrint(vVec);
      }
      if (local_1c % 4 == 3) {
        printf("\n");
      }
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vRes) % 4 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x533,"void Scl_LibertyPrintTemplates(Vec_Ptr_t *)");
}

Assistant:

void Scl_LibertyPrintTemplates( Vec_Ptr_t * vRes )
{
    Vec_Flt_t * vArray; int i;
    assert( Vec_PtrSize(vRes) % 4 == 0 );
    printf( "There are %d slew/load templates\n", Vec_PtrSize(vRes) % 4 );
    Vec_PtrForEachEntry( Vec_Flt_t *, vRes, vArray, i )
    {
        if ( i % 4 == 0 )
            printf( "%s\n", (char *)vArray );
        else if ( i % 4 == 1 )
            printf( "%d\n", (int)(vArray != NULL) );
        else if ( i % 4 == 2 || i % 4 == 3 )
            Vec_FltPrint( vArray );
        if ( i % 4 == 3 )
            printf( "\n" );
    }
}